

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::append_typed_destructor<LLVMBC::UnreachableInst>
          (LLVMContext *this,UnreachableInst *ptr)

{
  TypedDeleter<LLVMBC::UnreachableInst> *local_20;
  UnreachableInst *local_18;
  UnreachableInst *ptr_local;
  LLVMContext *this_local;
  
  local_18 = ptr;
  ptr_local = (UnreachableInst *)this;
  local_20 = construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::UnreachableInst>,LLVMBC::UnreachableInst*&>
                       (this,&local_18);
  std::
  vector<LLVMBC::LLVMContext::Deleter_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter_*>_>
  ::push_back(&this->typed_allocations,(value_type *)&local_20);
  return;
}

Assistant:

void append_typed_destructor(T *ptr)
	{
		typed_allocations.push_back(construct_trivial<TypedDeleter<T>>(ptr));
	}